

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::basic_substring<const_char>::first_not_of
          (basic_substring<const_char> *this,ro_substr chars,size_t start)

{
  size_t *psVar1;
  char cVar2;
  code *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  bool bVar6;
  error_flags eVar7;
  size_t sVar8;
  basic_substring<const_char> *pbVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar10 = chars.len;
  if (this->len < start) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      sVar8 = (*pcVar3)();
      return sVar8;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1756,"(start >= 0 && start <= len) || (start == len && len == 0)");
  }
  psVar1 = &this->len;
  pbVar9 = (basic_substring<const_char> *)0xffffffffffffffff;
  if (start < (basic_substring<const_char> *)*psVar1) {
    ppcVar4 = &this->str;
    do {
      pbVar9 = (basic_substring<const_char> *)start;
      bVar6 = uVar10 != 0;
      if ((uVar10 != 0) &&
         (cVar2 = *(char *)((long)&((basic_substring<const_char> *)start)->str + (long)*ppcVar4),
         pbVar9 = this, cVar2 != *chars.str)) {
        uVar5 = 1;
        do {
          uVar11 = uVar5;
          pbVar9 = (basic_substring<const_char> *)start;
          if (uVar10 == uVar11) break;
          pbVar9 = this;
          uVar5 = uVar11 + 1;
        } while (cVar2 != chars.str[uVar11]);
        bVar6 = uVar11 < uVar10;
      }
      this = pbVar9;
      pbVar9 = this;
    } while ((bVar6) &&
            (start = (long)&((basic_substring<const_char> *)start)->str + 1,
            pbVar9 = (basic_substring<const_char> *)0xffffffffffffffff,
            (basic_substring<const_char> *)start != (basic_substring<const_char> *)*psVar1));
  }
  return (size_t)pbVar9;
}

Assistant:

size_t first_not_of(ro_substr chars, size_t start=0) const
    {
        C4_ASSERT((start >= 0 && start <= len) || (start == len && len == 0));
        for(size_t i = start; i < len; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }